

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

char * Io_MvLoadFileBz2(char *pFileName,int *pnFileSize)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  size_t sVar5;
  int local_6c;
  int nBytes;
  char *p;
  buflist *buf;
  buflist *bufHead;
  buflist *pNext;
  int RetValue;
  int bzError;
  BZFILE *b;
  char *pContents;
  FILE *pFStack_28;
  int nFileSize;
  FILE *pFile;
  int *pnFileSize_local;
  char *pFileName_local;
  
  pContents._4_4_ = 0;
  buf = (buflist *)0x0;
  p = (char *)0x0;
  pFile = (FILE *)pnFileSize;
  pnFileSize_local = (int *)pFileName;
  pFStack_28 = fopen(pFileName,"rb");
  if (pFStack_28 == (FILE *)0x0) {
    Abc_Print(-1,"Io_MvLoadFileBz2(): The file is unavailable (absent or open).\n");
    pFileName_local = (char *)0x0;
  }
  else {
    _RetValue = BZ2_bzReadOpen((int *)((long)&pNext + 4),(FILE *)pFStack_28,0,0,(void *)0x0,0);
    if (pNext._4_4_ == 0) {
      do {
        if (buf == (buflist *)0x0) {
          buf = (buflist *)malloc(0x100010);
          p = (char *)buf;
        }
        else {
          pcVar2 = (char *)malloc(0x100010);
          *(char **)(p + 0x100008) = pcVar2;
          p = pcVar2;
        }
        iVar1 = BZ2_bzRead((int *)((long)&pNext + 4),_RetValue,p,0x100000);
        *(int *)(p + 0x100000) = iVar1;
        pContents._4_4_ = iVar1 + pContents._4_4_;
        p[0x100008] = '\0';
        p[0x100009] = '\0';
        p[0x10000a] = '\0';
        p[0x10000b] = '\0';
        p[0x10000c] = '\0';
        p[0x10000d] = '\0';
        p[0x10000e] = '\0';
        p[0x10000f] = '\0';
      } while (pNext._4_4_ == 0);
      if (pNext._4_4_ == 4) {
        local_6c = 0;
        BZ2_bzReadClose((int *)((long)&pNext + 4),_RetValue);
        pvVar3 = malloc((long)(pContents._4_4_ + 10));
        p = buf->buf;
        b = pvVar3;
        do {
          memcpy((void *)((long)pvVar3 + (long)local_6c),p,(long)*(int *)(p + 0x100000));
          local_6c = *(int *)(p + 0x100000) + local_6c;
          pcVar2 = *(char **)(p + 0x100008);
          if (p != (char *)0x0) {
            free(p);
          }
          p = pcVar2;
        } while (pcVar2 != (char *)0x0);
      }
      else {
        if (pNext._4_4_ != 0xfffffffb) {
          Abc_Print(-1,"Io_MvLoadFileBz2(): Unable to read the compressed BLIF.\n");
          return (char *)0x0;
        }
        BZ2_bzReadClose((int *)((long)&pNext + 4),_RetValue);
        fseek(pFStack_28,0,2);
        lVar4 = ftell(pFStack_28);
        pContents._4_4_ = (int)lVar4;
        if (pContents._4_4_ == 0) {
          Abc_Print(-1,"Io_MvLoadFileBz2(): The file is empty.\n");
          return (char *)0x0;
        }
        b = malloc((long)(pContents._4_4_ + 10));
        rewind(pFStack_28);
        sVar5 = fread(b,(long)pContents._4_4_,1,pFStack_28);
        pNext._0_4_ = (undefined4)sVar5;
      }
      fclose(pFStack_28);
      strcpy((char *)((long)b + (long)pContents._4_4_),"\n.end\n");
      pFile->_flags = pContents._4_4_;
      pFileName_local = (char *)b;
    }
    else {
      Abc_Print(-1,"Io_MvLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n",(ulong)pNext._4_4_
               );
      pFileName_local = (char *)0x0;
    }
  }
  return pFileName_local;
}

Assistant:

char * Io_MvLoadFileBz2( char * pFileName, int * pnFileSize )
{
    FILE    * pFile;
    int       nFileSize = 0;
    char    * pContents;
    BZFILE  * b;
    int       bzError, RetValue;
    struct buflist * pNext;
    buflist * bufHead = NULL, * buf = NULL;

    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Io_MvLoadFileBz2(): The file is unavailable (absent or open).\n" );
        return NULL;
    }
    b = BZ2_bzReadOpen(&bzError,pFile,0,0,NULL,0);
    if (bzError != BZ_OK) {
        Abc_Print( -1, "Io_MvLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n",bzError );
        return NULL;
    }
    do {
        if (!bufHead)
            buf = bufHead = ABC_ALLOC( buflist, 1 );
        else
            buf = buf->next = ABC_ALLOC( buflist, 1 );
        nFileSize += buf->nBuf = BZ2_bzRead(&bzError,b,buf->buf,1<<20);
        buf->next = NULL;
    } while (bzError == BZ_OK);
    if (bzError == BZ_STREAM_END) {
        // we're okay
        char * p;
        int nBytes = 0;
        BZ2_bzReadClose(&bzError,b);
        p = pContents = ABC_ALLOC( char, nFileSize + 10 );
        buf = bufHead;
        do {
            memcpy(p+nBytes,buf->buf,(size_t)buf->nBuf);
            nBytes += buf->nBuf;
//        } while((buf = buf->next));
            pNext = buf->next;
            ABC_FREE( buf );
        } while((buf = pNext));
    } else if (bzError == BZ_DATA_ERROR_MAGIC) {
        // not a BZIP2 file
        BZ2_bzReadClose(&bzError,b);
        fseek( pFile, 0, SEEK_END );
        nFileSize = ftell( pFile );
        if ( nFileSize == 0 )
        {
            Abc_Print( -1, "Io_MvLoadFileBz2(): The file is empty.\n" );
            return NULL;
        }
        pContents = ABC_ALLOC( char, nFileSize + 10 );
        rewind( pFile );
        RetValue = fread( pContents, nFileSize, 1, pFile );
    } else { 
        // Some other error.
        Abc_Print( -1, "Io_MvLoadFileBz2(): Unable to read the compressed BLIF.\n" );
        return NULL;
    }
    fclose( pFile );
    // finish off the file with the spare .end line
    // some benchmarks suddenly break off without this line
    strcpy( pContents + nFileSize, "\n.end\n" );
    *pnFileSize = nFileSize;
    return pContents;
}